

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

char * __thiscall kj::Vector<char>::add<char_const&>(Vector<char> *this,char *params)

{
  char *pcVar1;
  
  pcVar1 = (this->builder).pos;
  if (pcVar1 == (this->builder).endPtr) {
    grow(this,0);
    pcVar1 = (this->builder).pos;
  }
  *pcVar1 = *params;
  pcVar1 = (this->builder).pos;
  (this->builder).pos = pcVar1 + 1;
  return pcVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }